

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_color.h
# Opt level: O0

color_quad<unsigned_char,_int> * __thiscall
crnlib::color_quad<unsigned_char,_int>::set_noclamp_rgba
          (color_quad<unsigned_char,_int> *this,int red,int green,int blue,int alpha)

{
  int alpha_local;
  int blue_local;
  int green_local;
  int red_local;
  color_quad<unsigned_char,_int> *this_local;
  
  (this->field_0).field_0.r = (uchar)red;
  (this->field_0).field_0.g = (uchar)green;
  (this->field_0).field_0.b = (uchar)blue;
  (this->field_0).field_0.a = (uchar)alpha;
  return this;
}

Assistant:

inline color_quad& set_noclamp_rgba(parameter_type red, parameter_type green, parameter_type blue, parameter_type alpha)
        {
            CRNLIB_ASSERT((red >= component_traits::cMin) && (red <= component_traits::cMax));
            CRNLIB_ASSERT((green >= component_traits::cMin) && (green <= component_traits::cMax));
            CRNLIB_ASSERT((blue >= component_traits::cMin) && (blue <= component_traits::cMax));
            CRNLIB_ASSERT((alpha >= component_traits::cMin) && (alpha <= component_traits::cMax));

            r = static_cast<component_type>(red);
            g = static_cast<component_type>(green);
            b = static_cast<component_type>(blue);
            a = static_cast<component_type>(alpha);
            return *this;
        }